

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_Font::Internal_AfterModification(ON_Font *this)

{
  if (Unknown < this->m_font_origin) {
    this->m_font_origin = Unknown;
  }
  (this->m_panose1).m_prop8 = '\0';
  (this->m_panose1).m_prop9 = '\0';
  (this->m_panose1).m_family_kind = Any;
  (this->m_panose1).m_prop1 = '\0';
  (this->m_panose1).m_prop2 = '\0';
  (this->m_panose1).m_prop3 = '\0';
  (this->m_panose1).m_prop4 = '\0';
  (this->m_panose1).m_prop5 = '\0';
  (this->m_panose1).m_prop6 = '\0';
  (this->m_panose1).m_prop7 = '\0';
  this->m_simulated = '\0';
  std::__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_font_glyph_cache).
              super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void ON_Font::Internal_AfterModification(
)
{
  // This occures when a characteristic like PostScriptName(), weight, facename, style is changed
  // on a font that was original set from complete platform information.
  // It means the ON_Font may or may not have valid settings in platform specific
  // fields. In particular the Apple font name is typically no longer valid.
  if (ON_Font::Origin::Unset != m_font_origin && ON_Font::Origin::Unknown != m_font_origin)
    m_font_origin = ON_Font::Origin::Unknown;
  m_panose1 = ON_PANOSE1::Zero;
  m_simulated = 0;
  m_font_glyph_cache.reset();
}